

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::StringData> *value)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  StringData v;
  StringData local_50;
  
  bVar3 = MaybeNone(this);
  if (bVar3) {
    if (value->has_value_ == true) {
      plVar1 = (long *)((long)&value->contained + 0x10);
      if (*(long **)&value->contained != plVar1) {
        operator_delete(*(long **)&value->contained,*plVar1 + 1);
      }
    }
    value->has_value_ = false;
    bVar3 = true;
  }
  else {
    paVar2 = &local_50.value.field_2;
    local_50.value._M_string_length = 0;
    local_50.value.field_2._M_local_buf[0] = '\0';
    local_50.is_triple_quoted = false;
    local_50.single_quote = false;
    local_50.line_row = 0;
    local_50.line_col = 0;
    local_50.value._M_dataplus._M_p = (pointer)paVar2;
    bVar3 = ReadBasicType(this,&local_50);
    if (bVar3) {
      nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=(value,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.value._M_dataplus._M_p != paVar2) {
      operator_delete(local_50.value._M_dataplus._M_p,
                      CONCAT71(local_50.value.field_2._M_allocated_capacity._1_7_,
                               local_50.value.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::StringData> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::StringData v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}